

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O1

float __thiscall
tcu::Texture2DArrayView::sampleCompare
          (Texture2DArrayView *this,Sampler *sampler,float ref,float s,float t,float r,float lod)

{
  int numLevels;
  ConstPixelBufferAccess *levels;
  int iVar1;
  int iVar2;
  float fVar3;
  IVec3 local_24;
  
  levels = this->m_levels;
  numLevels = this->m_numLevels;
  fVar3 = floorf(r + 0.5);
  iVar1 = (int)fVar3;
  iVar2 = (levels->m_size).m_data[2] + -1;
  if (iVar1 < iVar2) {
    iVar2 = iVar1;
  }
  local_24.m_data[2] = 0;
  if (-1 < iVar1) {
    local_24.m_data[2] = iVar2;
  }
  local_24.m_data[0] = 0;
  local_24.m_data[1] = 0;
  fVar3 = sampleLevelArray2DCompare(levels,numLevels,sampler,ref,s,t,lod,&local_24);
  return fVar3;
}

Assistant:

float Texture2DArrayView::sampleCompare (const Sampler& sampler, float ref, float s, float t, float r, float lod) const
{
	return sampleLevelArray2DCompare(m_levels, m_numLevels, sampler, ref, s, t, lod, IVec3(0, 0, selectLayer(r)));
}